

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O0

UniquePtr<SDL_Window> * __thiscall
solitaire::graphics::SDLGraphicsSystemTests::makeSDLWindow
          (UniquePtr<SDL_Window> *__return_storage_ptr__,SDLGraphicsSystemTests *this,
          SDL_Window_conflict *ptr)

{
  shared_ptr<solitaire::SDL::PtrDeleterMock> local_60;
  PtrDeleter local_50;
  function<void_(SDL_Window_*)> local_40;
  SDL_Window_conflict *local_20;
  SDL_Window_conflict *ptr_local;
  SDLGraphicsSystemTests *this_local;
  
  local_20 = ptr;
  ptr_local = (SDL_Window_conflict *)this;
  this_local = (SDLGraphicsSystemTests *)__return_storage_ptr__;
  std::shared_ptr<solitaire::SDL::PtrDeleterMock>::
  shared_ptr<testing::StrictMock<solitaire::SDL::PtrDeleterMock>,void>
            (&local_60,&this->ptrDeleterMock);
  SDL::PtrDeleter::PtrDeleter(&local_50,&local_60);
  std::function<void(SDL_Window*)>::function<solitaire::SDL::PtrDeleter,void>
            ((function<void(SDL_Window*)> *)&local_40,&local_50);
  std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>::
  unique_ptr<std::function<void(SDL_Window*)>,void>
            ((unique_ptr<SDL_Window,std::function<void(SDL_Window*)>> *)__return_storage_ptr__,ptr,
             &local_40);
  std::function<void_(SDL_Window_*)>::~function(&local_40);
  SDL::PtrDeleter::~PtrDeleter(&local_50);
  std::shared_ptr<solitaire::SDL::PtrDeleterMock>::~shared_ptr(&local_60);
  return __return_storage_ptr__;
}

Assistant:

UniquePtr<SDL_Window> makeSDLWindow(SDL_Window* ptr) {
        return UniquePtr<SDL_Window> {ptr, PtrDeleter {ptrDeleterMock}};
    }